

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void postprocess_solver_solution(Instance *instance,SolveStatus status,Solution *solution)

{
  _Bool _Var1;
  bool bVar2;
  double dVar3;
  double gap_1;
  double SIX_PERCENT;
  double gap;
  _Bool closed_problem;
  _Bool primal_avail;
  Solution *solution_local;
  SolveStatus status_local;
  Instance *instance_local;
  
  bVar2 = (status & SOLVE_STATUS_CLOSED_PROBLEM) != SOLVE_STATUS_NULL;
  if ((status & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL) == SOLVE_STATUS_NULL) {
    if ((bVar2) && (dVar3 = solution_relgap(solution), -1000.0 <= dVar3)) {
      __assert_fail("gap < -1000.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                    ,0x194,
                    "void postprocess_solver_solution(const Instance *, SolveStatus, Solution *)");
    }
  }
  else {
    validate_primal_solution(instance,solution,1);
    if (bVar2) {
      dVar3 = solution_relgap(solution);
      _Var1 = feq(dVar3,0.0,0.06);
      if (!_Var1) {
        __assert_fail("feq(gap, 0.0, SIX_PERCENT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
                      ,0x18d,
                      "void postprocess_solver_solution(const Instance *, SolveStatus, Solution *)")
        ;
      }
    }
  }
  if ((status == SOLVE_STATUS_NULL) || ((status & SOLVE_STATUS_ERR) != SOLVE_STATUS_NULL)) {
    solution_clear(solution);
  }
  return;
}

Assistant:

static void postprocess_solver_solution(const Instance *instance,
                                        SolveStatus status,
                                        Solution *solution) {

    bool primal_avail = BOOL(status & SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL);
    bool closed_problem = BOOL(status & SOLVE_STATUS_CLOSED_PROBLEM);

    if (primal_avail) {
        validate_primal_solution(instance, solution, 1);
        if (closed_problem) {
#ifndef NDEBUG
            // If solution is optimal it should remain within a 6% optimal
            // gap
            double gap = solution_relgap(solution);
            const double SIX_PERCENT = 6.0 / 100;
            assert(feq(gap, 0.0, SIX_PERCENT));
#endif
        }
    } else {
        if (closed_problem) {
            double gap = solution_relgap(solution);
            // The gap should be highly negative
            assert(gap < -1000.0);
        }
    }

    if (status == SOLVE_STATUS_NULL || BOOL(status & SOLVE_STATUS_ERR)) {
        solution_clear(solution);
    }
}